

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O0

void __thiscall
QItemDelegate::drawFocus
          (QItemDelegate *this,QPainter *painter,QStyleOptionViewItem *option,QRect *rect)

{
  bool bVar1;
  Int IVar2;
  QItemDelegatePrivate *this_00;
  QColor *pQVar3;
  QWidget *pQVar4;
  QStyle *pQVar5;
  undefined8 *in_RCX;
  QStyleOptionViewItem *in_RDX;
  undefined8 in_RSI;
  long in_FS_OFFSET;
  QStyle *style;
  QWidget *widget;
  ColorGroup cg;
  QItemDelegatePrivate *d;
  QStyleOptionFocusRect o;
  ColorRole in_stack_ffffffffffffff38;
  ColorGroup in_stack_ffffffffffffff3c;
  QStyleOption *in_stack_ffffffffffffff40;
  byte local_a9;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_64;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_60;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_5c;
  undefined1 local_58 [8];
  QFlags<QStyle::StateFlag> aQStack_50 [2];
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_18;
  undefined4 local_10;
  ushort local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QItemDelegate *)0x8557ba);
  local_5c.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_5c);
  local_a9 = 1;
  if (IVar2 != 0) {
    bVar1 = QRect::isValid((QRect *)in_stack_ffffffffffffff40);
    local_a9 = bVar1 ^ 0xff;
  }
  if ((local_a9 & 1) == 0) {
    memset(local_58,0xaa,0x50);
    QStyleOptionFocusRect::QStyleOptionFocusRect((QStyleOptionFocusRect *)0x85582a);
    QStyleOption::operator=
              (in_stack_ffffffffffffff40,
               (QStyleOption *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_48 = *in_RCX;
    local_40 = in_RCX[1];
    QFlags<QStyle::StateFlag>::operator|=(aQStack_50,State_KeyboardFocusChange);
    QFlags<QStyle::StateFlag>::operator|=(aQStack_50,State_Item);
    local_60.super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorage<QStyle::StateFlag>)
         QFlags<QStyle::StateFlag>::operator&
                   ((QFlags<QStyle::StateFlag> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c
                   );
    ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_60);
    local_64.super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorage<QStyle::StateFlag>)
         QFlags<QStyle::StateFlag>::operator&
                   ((QFlags<QStyle::StateFlag> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c
                   );
    ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_64);
    pQVar3 = QPalette::color((QPalette *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                             in_stack_ffffffffffffff38);
    local_18 = *(undefined8 *)pQVar3;
    local_10 = *(undefined4 *)((long)&pQVar3->ct + 4);
    local_c = (pQVar3->ct).argb.pad;
    pQVar4 = QItemDelegatePrivate::widget(this_00,in_RDX);
    if (pQVar4 == (QWidget *)0x0) {
      pQVar5 = QApplication::style();
    }
    else {
      pQVar5 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    }
    (**(code **)(*(long *)pQVar5 + 0xb0))(pQVar5,3,local_58,in_RSI,pQVar4);
    QStyleOptionFocusRect::~QStyleOptionFocusRect((QStyleOptionFocusRect *)0x855994);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemDelegate::drawFocus(QPainter *painter,
                              const QStyleOptionViewItem &option,
                              const QRect &rect) const
{
    Q_D(const QItemDelegate);
    if ((option.state & QStyle::State_HasFocus) == 0 || !rect.isValid())
        return;
    QStyleOptionFocusRect o;
    o.QStyleOption::operator=(option);
    o.rect = rect;
    o.state |= QStyle::State_KeyboardFocusChange;
    o.state |= QStyle::State_Item;
    QPalette::ColorGroup cg = (option.state & QStyle::State_Enabled)
                              ? QPalette::Normal : QPalette::Disabled;
    o.backgroundColor = option.palette.color(cg, (option.state & QStyle::State_Selected)
                                             ? QPalette::Highlight : QPalette::Window);
    const QWidget *widget = d->widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();
    style->drawPrimitive(QStyle::PE_FrameFocusRect, &o, painter, widget);
}